

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileData.h
# Opt level: O2

void __thiscall Assimp::Q3BSP::Q3BSPModel::~Q3BSPModel(Q3BSPModel *this)

{
  pointer ppsVar1;
  pointer ppsVar2;
  pointer ppsVar3;
  pointer ppsVar4;
  pointer ppsVar5;
  pointer ppsVar6;
  uint uVar7;
  
  uVar7 = 0;
  while( true ) {
    ppsVar1 = (this->m_Lumps).
              super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_Lumps).
                      super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar1 >> 3) <=
        (ulong)uVar7) break;
    operator_delete(ppsVar1[uVar7],8);
    uVar7 = uVar7 + 1;
  }
  uVar7 = 0;
  while( true ) {
    ppsVar2 = (this->m_Vertices).
              super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_Vertices).
                      super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar2 >> 3) <=
        (ulong)uVar7) break;
    operator_delete(ppsVar2[uVar7],0x2c);
    uVar7 = uVar7 + 1;
  }
  uVar7 = 0;
  while( true ) {
    ppsVar3 = (this->m_Faces).
              super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_Faces).
                      super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar3 >> 3) <=
        (ulong)uVar7) break;
    operator_delete(ppsVar3[uVar7],0x68);
    uVar7 = uVar7 + 1;
  }
  uVar7 = 0;
  while( true ) {
    ppsVar4 = (this->m_Textures).
              super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_Textures).
                      super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar4 >> 3) <=
        (ulong)uVar7) break;
    operator_delete(ppsVar4[uVar7],0x48);
    uVar7 = uVar7 + 1;
  }
  uVar7 = 0;
  while( true ) {
    ppsVar5 = (this->m_Lightmaps).
              super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppsVar6 = (this->m_Lightmaps).
              super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppsVar6 - (long)ppsVar5 >> 3) <= (ulong)uVar7) break;
    operator_delete(ppsVar5[uVar7],0xc000);
    uVar7 = uVar7 + 1;
  }
  ppsVar1 = (this->m_Lumps).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Lumps).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppsVar1) {
    (this->m_Lumps).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppsVar1;
  }
  ppsVar2 = (this->m_Vertices).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Vertices).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppsVar2) {
    (this->m_Vertices).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppsVar2;
  }
  ppsVar3 = (this->m_Faces).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Faces).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppsVar3) {
    (this->m_Faces).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppsVar3;
  }
  ppsVar4 = (this->m_Textures).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Textures).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppsVar4) {
    (this->m_Textures).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppsVar4;
  }
  if (ppsVar6 != ppsVar5) {
    (this->m_Lightmaps).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppsVar5;
  }
  std::__cxx11::string::~string((string *)&this->m_ModelName);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_EntityData).super__Vector_base<char,_std::allocator<char>_>);
  std::
  _Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>::
  ~_Vector_base(&(this->m_Lightmaps).
                 super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
               );
  std::_Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
  ::~_Vector_base(&(this->m_Textures).
                   super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                 );
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_Indices).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>::
  ~_Vector_base(&(this->m_Faces).
                 super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
               );
  std::_Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>::
  ~_Vector_base(&(this->m_Vertices).
                 super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
               );
  std::_Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>::
  ~_Vector_base(&(this->m_Lumps).
                 super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
               );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return;
}

Assistant:

~Q3BSPModel() {
        for ( unsigned int i=0; i<m_Lumps.size(); i++ ) {
            delete m_Lumps[ i ];
        }
        for ( unsigned int i=0; i<m_Vertices.size(); i++ ) {
            delete m_Vertices[ i ];
        }
        for ( unsigned int i=0; i<m_Faces.size(); i++ ) {
            delete m_Faces[ i ];
        }
        for ( unsigned int i=0; i<m_Textures.size(); i++ ) {
            delete m_Textures[ i ];
        }
        for ( unsigned int i=0; i<m_Lightmaps.size(); i++ ) {
            delete m_Lightmaps[ i ];
        }

        m_Lumps.clear();
        m_Vertices.clear();
        m_Faces.clear();
        m_Textures.clear();
        m_Lightmaps.clear();
    }